

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

Coin * AccessByTxid(CCoinsViewCache *view,Txid *txid)

{
  iterator iVar1;
  Coin *pCVar2;
  long in_FS_OFFSET;
  COutPoint iter;
  COutPoint local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(txid->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  local_58.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((txid->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  for (local_58.n = 0; local_58.n < MAX_OUTPUTS_PER_BLOCK; local_58.n = local_58.n + 1) {
    iVar1 = CCoinsViewCache::FetchCoin(view,&local_58);
    pCVar2 = (Coin *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x48);
    if (iVar1.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur
        == (__node_type *)0x0) {
      pCVar2 = &coinEmpty;
    }
    if ((pCVar2->out).nValue != -1) goto LAB_0012f1bc;
  }
  pCVar2 = &coinEmpty;
LAB_0012f1bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

const Coin& AccessByTxid(const CCoinsViewCache& view, const Txid& txid)
{
    COutPoint iter(txid, 0);
    while (iter.n < MAX_OUTPUTS_PER_BLOCK) {
        const Coin& alternate = view.AccessCoin(iter);
        if (!alternate.IsSpent()) return alternate;
        ++iter.n;
    }
    return coinEmpty;
}